

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O0

double anon_unknown.dwarf_16f66::sampleY<Imath_3_2::half>
                 (TypedImageChannel<Imath_3_2::half> *channel,int h,int x,double y,Extrapolation ext
                 )

{
  int a;
  int a_00;
  undefined4 in_ECX;
  int in_ESI;
  float fVar1;
  double in_XMM0_Qa;
  double vt;
  double vs;
  double t;
  double s;
  int yt;
  int ys;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  TypedImageChannel<Imath_3_2::half> *in_stack_ffffffffffffffa0;
  int x_00;
  double local_58;
  double local_48;
  double local_40;
  
  a = Imath_3_2::floor<double>(in_XMM0_Qa);
  a_00 = a + 1;
  local_40 = 0.0;
  local_48 = 0.0;
  x_00 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  switch(in_ECX) {
  case 0:
    if ((a < 0) || (in_ESI <= a)) {
      local_58 = 0.0;
    }
    else {
      TypedImageChannel<Imath_3_2::half>::operator()
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
      fVar1 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_ffffffffffffffa0);
      local_58 = (double)fVar1;
    }
    local_40 = local_58;
    if ((a_00 < 0) || (in_ESI <= a_00)) {
      local_48 = 0.0;
    }
    else {
      TypedImageChannel<Imath_3_2::half>::operator()
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
      fVar1 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_ffffffffffffffa0);
      local_48 = (double)fVar1;
    }
    break;
  case 1:
    Imath_3_2::clamp<int>(a,0,in_ESI + -1);
    Imath_3_2::clamp<int>(a_00,0,in_ESI + -1);
    TypedImageChannel<Imath_3_2::half>::operator()
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    fVar1 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_ffffffffffffffa0);
    local_40 = (double)fVar1;
    TypedImageChannel<Imath_3_2::half>::operator()
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    fVar1 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_ffffffffffffffa0);
    local_48 = (double)fVar1;
    break;
  case 2:
    Imath_3_2::modp(x_00,(int)in_stack_ffffffffffffffa0);
    Imath_3_2::modp((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(int)in_stack_ffffffffffffffa0);
    TypedImageChannel<Imath_3_2::half>::operator()
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    fVar1 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_ffffffffffffffa0);
    local_40 = (double)fVar1;
    TypedImageChannel<Imath_3_2::half>::operator()
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    fVar1 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_ffffffffffffffa0);
    local_48 = (double)fVar1;
    break;
  case 3:
    mirror(x_00,(int)in_stack_ffffffffffffffa0);
    mirror((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(int)in_stack_ffffffffffffffa0);
    TypedImageChannel<Imath_3_2::half>::operator()
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    fVar1 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_ffffffffffffffa0);
    local_40 = (double)fVar1;
    TypedImageChannel<Imath_3_2::half>::operator()
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    fVar1 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_ffffffffffffffa0);
    local_48 = (double)fVar1;
  }
  return ((double)a_00 - in_XMM0_Qa) * local_40 + (1.0 - ((double)a_00 - in_XMM0_Qa)) * local_48;
}

Assistant:

double
sampleY (
    const TypedImageChannel<T>& channel,
    int                         h,
    int                         x,
    double                      y,
    Extrapolation               ext)
{
    //
    // Sample an image channel at location (x, y), where
    // x is an integer, and y is a floating point number.
    //

    int    ys = IMATH_NAMESPACE::floor (y);
    int    yt = ys + 1;
    double s  = yt - y;
    double t  = 1 - s;
    double vs = 0.0;
    double vt = 0.0;

    switch (ext)
    {
        case BLACK:

            vs = (ys >= 0 && ys < h) ? double (channel (x, ys)) : 0.0;
            vt = (yt >= 0 && yt < h) ? double (channel (x, yt)) : 0.0;
            break;

        case CLAMP:

            ys = IMATH_NAMESPACE::clamp (ys, 0, h - 1);
            yt = IMATH_NAMESPACE::clamp (yt, 0, h - 1);
            vs = channel (x, ys);
            vt = channel (x, yt);
            break;

        case PERIODIC:

            ys = modp (ys, h);
            yt = modp (yt, h);
            vs = channel (x, ys);
            vt = channel (x, yt);
            break;

        case MIRROR:

            ys = mirror (ys, h);
            yt = mirror (yt, h);
            vs = channel (x, ys);
            vt = channel (x, yt);
            break;
    }

    return s * vs + t * vt;
}